

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell.c
# Opt level: O2

int percent_success(int spell)

{
  ushort uVar1;
  schar sVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int odd;
  int iVar8;
  uint uVar9;
  int iVar10;
  
  iVar8 = urole.spelheal;
  iVar10 = urole.spelbase;
  sVar2 = acurr(urole.spelstat);
  if ((uarm == (obj *)0x0) ||
     (6 < (ushort)((*(ushort *)&objects[uarm->otyp].field_0x11 >> 4 & 0x1f) - 0xb))) {
    if ((uarmc != (obj *)0x0) && (uarmc->otyp == 0x81)) {
      iVar10 = iVar10 - urole.spelarmr;
    }
  }
  else {
    iVar4 = urole.spelarmr;
    if ((uarmc != (obj *)0x0) && (uarmc->otyp == 0x81)) {
      iVar4 = urole.spelarmr / 2;
    }
    iVar10 = iVar10 + iVar4;
  }
  iVar4 = 0;
  if (uarms != (obj *)0x0) {
    iVar4 = urole.spelshld;
  }
  iVar4 = iVar4 + iVar10;
  if (uarmh != (obj *)0x0) {
    lVar7 = (long)uarmh->otyp;
    iVar10 = iVar4 + 4;
    if ((ushort)((*(ushort *)&objects[lVar7].field_0x11 >> 4 & 0x1f) - 0x12) < 0xfff9) {
      iVar10 = iVar4;
    }
    if (lVar7 == 0x51) {
      iVar10 = iVar4;
    }
    iVar4 = iVar10 + 4;
    if (lVar7 != 0x4f) {
      iVar4 = iVar10;
    }
  }
  iVar10 = iVar4;
  if ((uarmg != (obj *)0x0) &&
     (iVar10 = iVar4 + 6,
     6 < (ushort)((*(ushort *)&objects[uarmg->otyp].field_0x11 >> 4 & 0x1f) - 0xb))) {
    iVar10 = iVar4;
  }
  iVar4 = iVar10;
  if ((uarmf != (obj *)0x0) &&
     (iVar4 = iVar10 + 2,
     6 < (ushort)((*(ushort *)&objects[uarmf->otyp].field_0x11 >> 4 & 0x1f) - 0xb))) {
    iVar4 = iVar10;
  }
  uVar1 = spl_book[spell].sp_id;
  iVar10 = 0;
  if (urole.spelspec == (short)uVar1) {
    iVar10 = urole.spelsbon;
  }
  iVar10 = iVar10 + iVar4;
  if ((uVar1 - 0x185 < 0x16) && ((0x261011U >> (uVar1 - 0x185 & 0x1f) & 1) != 0)) {
    iVar10 = iVar10 + iVar8;
  }
  uVar6 = (uint)((short)(sVar2 * 0xb) / 2);
  bVar3 = u.weapon_skills[objects[(short)uVar1].oc_subtyp].skill;
  iVar8 = 1;
  if ((char)bVar3 < '\x02') {
    bVar3 = 1;
  }
  iVar4 = u.ulevel / -3 + (uint)bVar3 * -6 + spl_book[spell].sp_lev * 4 + 1;
  if (iVar4 < 1) {
    iVar8 = (iVar4 * -0xf) / (int)spl_book[spell].sp_lev;
    if (0x13 < iVar8) {
      iVar8 = 0x14;
    }
    uVar6 = uVar6 + iVar8;
  }
  else {
    iVar4 = iVar4 * 900 + 2000;
    for (; iVar5 = iVar4 - iVar8, iVar8 <= iVar4; iVar8 = iVar8 + 2) {
      uVar6 = uVar6 - 1;
      iVar4 = iVar5;
    }
  }
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  uVar9 = 0x78;
  if ((int)uVar6 < 0x78) {
    uVar9 = uVar6;
  }
  if ((uarms != (obj *)0x0) && (iVar8 = weight(uarms), (int)(uint)objects[0x88].oc_weight < iVar8))
  {
    if (urole.spelspec == spl_book[spell].sp_id) {
      uVar9 = uVar9 >> 1;
    }
    else {
      uVar9 = uVar9 >> 2;
    }
  }
  if (0x13 < iVar10) {
    iVar10 = 0x14;
  }
  iVar10 = ((0x14 - iVar10) * uVar9) / 0xf - iVar10;
  if (99 < iVar10) {
    iVar10 = 100;
  }
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

static int percent_success(int spell)
{
	/* Intrinsic and learned ability are combined to calculate
	 * the probability of player's success at cast a given spell.
	 */
	int chance, splcaster, special, statused;
	int difficulty;
	int skill;

	/* Calculate intrinsic ability (splcaster) */

	splcaster = urole.spelbase;
	special = urole.spelheal;
	statused = ACURR(urole.spelstat);

	if (uarm && is_metallic(uarm))
	    splcaster += (uarmc && uarmc->otyp == ROBE) ?
		urole.spelarmr/2 : urole.spelarmr;
	else if (uarmc && uarmc->otyp == ROBE)
	    splcaster -= urole.spelarmr;
	if (uarms) splcaster += urole.spelshld;

	if (uarmh && is_metallic(uarmh) && uarmh->otyp != HELM_OF_BRILLIANCE)
		splcaster += uarmhbon;
	if (uarmh && uarmh->otyp == TINFOIL_HAT)
		splcaster += uarmhbon;
	if (uarmg && is_metallic(uarmg)) splcaster += uarmgbon;
	if (uarmf && is_metallic(uarmf)) splcaster += uarmfbon;

	if (spellid(spell) == urole.spelspec)
		splcaster += urole.spelsbon;

	/* `healing spell' bonus */
	if (spellid(spell) == SPE_HEALING ||
	    spellid(spell) == SPE_EXTRA_HEALING ||
	    spellid(spell) == SPE_CURE_BLINDNESS ||
	    spellid(spell) == SPE_CURE_SICKNESS ||
	    spellid(spell) == SPE_RESTORE_ABILITY ||
	    spellid(spell) == SPE_REMOVE_CURSE) splcaster += special;

	if (splcaster > 20) splcaster = 20;

	/* Calculate learned ability */

	/* Players basic likelihood of being able to cast any spell
	 * is based of their `magic' statistic. (Int or Wis)
	 */
	chance = 11 * statused / 2;

	/*
	 * High level spells are harder.  Easier for higher level casters.
	 * The difficulty is based on the hero's level and their skill level
	 * in that spell type.
	 */
	skill = P_SKILL(spell_skilltype(spellid(spell)));
	skill = max(skill,P_UNSKILLED) - 1;	/* unskilled => 0 */
	difficulty= (spellev(spell)-1) * 4 - ((skill * 6) + (u.ulevel/3) + 1);

	if (difficulty > 0) {
		/* Player is too low level or unskilled. */
		chance -= isqrt(900 * difficulty + 2000);
	} else {
		/* Player is above level.  Learning continues, but the
		 * law of diminishing returns sets in quickly for
		 * low-level spells.  That is, a player quickly gains
		 * no advantage for raising level.
		 */
		int learning = 15 * -difficulty / spellev(spell);
		chance += learning > 20 ? 20 : learning;
	}

	/* Clamp the chance: >18 stat and advanced learning only help
	 * to a limit, while chances below "hopeless" only raise the
	 * specter of overflowing 16-bit ints (and permit wearing a
	 * shield to raise the chances :-).
	 */
	if (chance < 0) chance = 0;
	if (chance > 120) chance = 120;

	/* Wearing anything but a light shield makes it very awkward
	 * to cast a spell.  The penalty is not quite so bad for the
	 * player's role-specific spell.
	 */
	if (uarms && weight(uarms) > (int) objects[SMALL_SHIELD].oc_weight) {
		if (spellid(spell) == urole.spelspec) {
			chance /= 2;
		} else {
			chance /= 4;
		}
	}

	/* Finally, chance (based on player intell/wisdom and level) is
	 * combined with ability (based on player intrinsics and
	 * encumbrances).  No matter how intelligent/wise and advanced
	 * a player is, intrinsics and encumbrance can prevent casting;
	 * and no matter how able, learning is always required.
	 */
	chance = chance * (20-splcaster) / 15 - splcaster;

	/* Clamp to percentile */
	if (chance > 100) chance = 100;
	if (chance < 0) chance = 0;

	return chance;
}